

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext *ctx)

{
  FunctionData *function;
  ScopeData *pSVar1;
  ModuleData *pMVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  ExpressionContext *this;
  ulong uVar6;
  
  PrintIndentedLine(ctx,"// Register functions");
  this = ctx->ctx;
  if ((this->functions).count != 0) {
    uVar6 = 0;
    do {
      function = (this->functions).data[uVar6];
      bVar4 = ExpressionContext::IsGenericFunction(this,function);
      if (bVar4) {
        PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // generic function \'%.*s\'",uVar6 & 0xffffffff,
                          (ulong)(uint)(*(int *)&(function->name->name).end -
                                       (int)(function->name->name).begin));
      }
      else {
        pSVar1 = function->scope;
        if (((((pSVar1 == ctx->ctx->globalScope) || (pSVar1->ownerNamespace != (NamespaceData *)0x0)
              ) || (pSVar1->ownerType != (TypeBase *)0x0)) &&
            ((*(function->name->name).begin != '$' && (function->isHidden != true)))) ||
           (pMVar2 = function->importModule, pMVar2 == (ModuleData *)0x0)) {
          PrintIndent(ctx);
          Print(ctx,"__nullcFR[%d] = __nullcRegisterFunction(\"",uVar6 & 0xffffffff);
          TranslateFunctionName(ctx,function);
          Print(ctx,"\", (void*)");
          TranslateFunctionName(ctx,function);
          bVar4 = UseNonStaticTemplate(ctx,function);
          if (bVar4) {
            Print(ctx,"<0>");
          }
          if (function->contextType == (TypeBase *)0x0) {
            Print(ctx,", -1");
          }
          else {
            Print(ctx,", __nullcTR[%d]",(ulong)function->contextType->typeIndex);
          }
          pcVar5 = ", FunctionCategory::THISCALL";
          if (((function->scope->ownerType == (TypeBase *)0x0) &&
              (pcVar5 = ", FunctionCategory::COROUTINE", function->coroutine == false)) &&
             (pcVar5 = ", FunctionCategory::LOCAL",
             (TypeRef *)function->contextType == ctx->ctx->typeVoid->refType)) {
            pcVar5 = ", FunctionCategory::NORMAL";
          }
          Print(ctx,pcVar5);
          pcVar5 = ", false);";
          if (*(function->name->name).begin == '$') {
            pcVar5 = ", true);";
          }
          Print(ctx,pcVar5);
          OutputContext::Print(ctx->output,"\n",1);
        }
        else {
          pcVar5 = (pMVar2->name).begin;
          pcVar3 = (function->name->name).begin;
          PrintIndentedLine(ctx,"__nullcFR[%d] = 0; // module \'%.*s\' internal function \'%.*s\'",
                            uVar6 & 0xffffffff,
                            (ulong)(uint)(*(int *)&(pMVar2->name).end - (int)pcVar5),pcVar5,
                            (ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar3),pcVar3)
          ;
        }
      }
      uVar6 = uVar6 + 1;
      this = ctx->ctx;
    } while (uVar6 < (this->functions).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleGlobalFunctionInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register functions");

	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		if(ctx.ctx.IsGenericFunction(function))
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // generic function '%.*s'", i, FMT_ISTR(function->name->name));
			continue;
		}

		bool isStatic = false;

		if(function->scope != ctx.ctx.globalScope && !function->scope->ownerNamespace && !function->scope->ownerType)
			isStatic = true;
		else if(*function->name->name.begin == '$')
			isStatic = true;
		else if(function->isHidden)
			isStatic = true;

		if(isStatic && function->importModule)
		{
			PrintIndentedLine(ctx, "__nullcFR[%d] = 0; // module '%.*s' internal function '%.*s'", i, FMT_ISTR(function->importModule->name), FMT_ISTR(function->name->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcFR[%d] = __nullcRegisterFunction(\"", i);
		TranslateFunctionName(ctx, function);
		Print(ctx, "\", (void*)");
		TranslateFunctionName(ctx, function);

		if(UseNonStaticTemplate(ctx, function))
			Print(ctx, "<0>");

		if(function->contextType)
			Print(ctx, ", __nullcTR[%d]", function->contextType->typeIndex);
		else
			Print(ctx, ", -1");

		if(function->scope->ownerType)
			Print(ctx, ", FunctionCategory::THISCALL");
		else if(function->coroutine)
			Print(ctx, ", FunctionCategory::COROUTINE");
		else if(function->contextType != ctx.ctx.typeVoid->refType)
			Print(ctx, ", FunctionCategory::LOCAL");
		else
			Print(ctx, ", FunctionCategory::NORMAL");

		if(*function->name->name.begin == '$')
			Print(ctx, ", true);");
		else
			Print(ctx, ", false);");

		PrintLine(ctx);
	}

	PrintLine(ctx);
}